

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_intval(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  anon_union_8_3_18420de5_for_x aVar2;
  
  if (nArg < 1) {
    aVar2.rVal = 0.0;
  }
  else {
    pjVar1 = *apArg;
    jx9MemObjToInteger(pjVar1);
    aVar2 = pjVar1->x;
  }
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  pjVar1->x = aVar2;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_intval(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 ){
		/* return 0 */
		jx9_result_int(pCtx, 0);
	}else{
		sxi64 iVal;
		/* Perform the cast */
		iVal = jx9_value_to_int64(apArg[0]);
		jx9_result_int64(pCtx, iVal);
	}
	return JX9_OK;
}